

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O2

void __thiscall SkipList::Node::Node(Node *this,int inKey,Elem *inVal)

{
  this->top = (Node *)0x0;
  this->bot = (Node *)0x0;
  this->prev = (Node *)0x0;
  this->next = (Node *)0x0;
  std::__cxx11::string::string((string *)&this->val,(string *)inVal);
  this->key = inKey;
  return;
}

Assistant:

SkipList::Node::Node(int inKey, const Elem& inVal) :
	key(inKey),
	val(inVal)
{}